

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O1

feed_db_status_t begin_transaction_db(feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  feed_db_status_t fVar4;
  char *err_msg;
  char *local_20;
  
  if (db->in_transaction == 0) {
    local_20 = (char *)0x0;
    fVar4 = FEED_DB_ERROR;
    iVar1 = sqlite3_exec(db->conn,"BEGIN TRANSACTION;",(sqlite3_callback)0x0,(void *)0x0,&local_20);
    pcVar2 = local_20;
    db->rc = iVar1;
    if (iVar1 == 0) {
      db->in_transaction = 1;
      fVar4 = FEED_DB_SUCCESS;
    }
    else {
      pcVar3 = strdup(local_20);
      db->error_msg = pcVar3;
      sqlite3_free(pcVar2);
    }
  }
  else {
    pcVar2 = strdup("cgtfs has already opened an unfinished transaction");
    db->error_msg = pcVar2;
    fVar4 = FEED_DB_ERROR;
  }
  return fVar4;
}

Assistant:

feed_db_status_t begin_transaction_db(feed_db_t *db) {

    if (db->in_transaction != 0) {
        db->error_msg = strdup("cgtfs has already opened an unfinished transaction");
        return FEED_DB_ERROR;
    }

    char *err_msg = 0;
    db->rc = sqlite3_exec(db->conn, "BEGIN TRANSACTION;", NULL, NULL, &err_msg);

    if (db->rc != SQLITE_OK) {
        db->error_msg = strdup(err_msg);
        sqlite3_free(err_msg);
        return FEED_DB_ERROR;
    }

    db->in_transaction = 1;

    return FEED_DB_SUCCESS;
}